

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkexmlParser.cpp
# Opt level: O2

shared_ptr<Node> __thiscall SkexmlParser::MakeNode(SkexmlParser *this,string *name,ifstream *file)

{
  uint uVar1;
  Node *pNVar2;
  size_type sVar3;
  bool bVar4;
  ulong uVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *this_00;
  ulong uVar6;
  shared_ptr<Node> sVar7;
  string input;
  string attribute_name;
  SkexmlParser local_140 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_138;
  string local_130;
  string value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string child_name;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::make_shared<Node,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::string((string *)&child_name,"",(allocator *)&input);
  std::__cxx11::string::string((string *)&input,"",(allocator *)&attribute_name);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)file,(string *)&input);
  Utils::RemoveEndline(&input);
  while (((byte)file[*(long *)(*(long *)file + -0x18) + 0x20] & 2) == 0) {
    if (1 < input._M_string_length) {
      std::__cxx11::string::substr((ulong)&attribute_name,(ulong)&input);
      bVar4 = std::operator==(&attribute_name,"[/");
      std::__cxx11::string::~string((string *)&attribute_name);
      if (bVar4) break;
    }
    std::__cxx11::string::substr((ulong)&attribute_name,(ulong)&input);
    bVar4 = std::operator!=(&attribute_name,"[");
    std::__cxx11::string::~string((string *)&attribute_name);
    if (bVar4) {
LAB_00163550:
      sVar3 = input._M_string_length;
      if (input._M_string_length < 2) {
LAB_0016358a:
        uVar1 = *(uint *)(file + *(long *)(*(long *)file + -0x18) + 0x20);
        if (1 < sVar3) {
          std::__cxx11::string::~string((string *)&local_f0);
        }
        if ((uVar1 & 2) != 0) goto LAB_00163794;
        pNVar2 = *(Node **)this;
        std::__cxx11::string::string((string *)&local_70,"List",(allocator *)&attribute_name);
        std::__cxx11::string::string((string *)&local_50,(string *)&input);
        Node::AddListAttribute(pNVar2,&local_70,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)file,(string *)&input);
        Utils::RemoveEndline(&input);
        goto LAB_00163550;
      }
      std::__cxx11::string::substr((ulong)&local_f0,(ulong)&input);
      bVar4 = std::operator!=(&local_f0,"[/");
      if (bVar4) goto LAB_0016358a;
      std::__cxx11::string::~string((string *)&local_f0);
LAB_00163794:
      if (((byte)file[*(long *)(*(long *)file + -0x18) + 0x20] & 2) != 0) break;
      if (1 < input._M_string_length) {
        std::__cxx11::string::substr((ulong)&attribute_name,(ulong)&input);
        bVar4 = std::operator==(&attribute_name,"[/");
        std::__cxx11::string::~string((string *)&attribute_name);
        if (bVar4) break;
      }
    }
    else {
      uVar6 = input._M_string_length - 1;
      uVar5 = std::__cxx11::string::find((char *)&input,0x1790a3);
      if (uVar5 < uVar6) {
        std::__cxx11::string::find((char *)&input,0x1790a3);
        this_00 = &attribute_name;
        std::__cxx11::string::substr((ulong)this_00,(ulong)&input);
        std::__cxx11::string::find((char *)&input,0x1790a3);
        std::__cxx11::string::find((char *)&input,0x1790a5);
        std::__cxx11::string::substr((ulong)&value,(ulong)&input);
        pNVar2 = *(Node **)this;
        std::__cxx11::string::string((string *)&local_90,(string *)this_00);
        std::__cxx11::string::string((string *)&local_b0,(string *)&value);
        Node::AddAttribute(pNVar2,&local_90,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&value);
      }
      else {
        std::__cxx11::string::substr((ulong)&attribute_name,(ulong)&input);
        std::__cxx11::string::operator=((string *)&child_name,(string *)&attribute_name);
        std::__cxx11::string::~string((string *)&attribute_name);
        pNVar2 = *(Node **)this;
        std::__cxx11::string::string((string *)&local_130,(string *)&child_name);
        MakeNode(local_140,&local_130,file);
        Node::AddChild(pNVar2,(shared_ptr<Node> *)local_140);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138);
        this_00 = &local_130;
      }
      std::__cxx11::string::~string((string *)this_00);
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)file,(string *)&input)
    ;
    Utils::RemoveEndline(&input);
  }
  std::__cxx11::string::~string((string *)&input);
  std::__cxx11::string::~string((string *)&child_name);
  sVar7.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar7.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Node>)sVar7.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Node> SkexmlParser::MakeNode(std::string name, std::ifstream& file) {
    std::shared_ptr<Node> node = std::make_shared<Node>(name);
    std::string child_name = "";
    std::string input = "";
    std::getline(file, input);
    Utils::RemoveEndline(input);
    while(!file.eof())
    {
        if(input.length() > 1 and input.substr(0,2) == "[/")
            return node;
        else if(input.substr(0,1) != "[") {
            while((input.length() < 2 or input.substr(0,2) != "[/") and !file.eof())
            {
                node->AddListAttribute("List", input);
                std::getline(file, input);
                Utils::RemoveEndline(input);
            }
            if(file.eof() or (input.length() > 1 and input.substr(0,2) == "[/"))
                return node;
        }
        else if(input.length() - 1 > input.find("]")) {
            std::string attribute_name = input.substr(1, input.find("]") - 1);
            unsigned long value_begin = input.find("]") + 1;
            unsigned long value_end = input.find("[/") - value_begin;
            std::string value = input.substr(value_begin, value_end);
            node->AddAttribute(attribute_name, value);
        }
        else {
            child_name = input.substr(1, input.length() - 2);
            node->AddChild(MakeNode(child_name, file));
        }
        std::getline(file, input);
        Utils::RemoveEndline(input);
    }
    return node;
}